

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O2

void internal_free_class(gravity_hash_t *hashtable,gravity_value_t key,gravity_value_t value,
                        void *data)

{
  int iVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 f;
  
  f = value.field_1;
  if ((gravity_class_function != value.isa) || (gravity_class_string != key.isa)) {
    return;
  }
  if (*(gravity_exec_type *)&(f.p)->xdata == EXEC_TYPE_SPECIAL) {
    if ((gravity_function_t *)(f.p)->superlook != (gravity_function_t *)0x0) {
      gravity_function_free((gravity_vm *)0x0,(gravity_function_t *)(f.p)->superlook);
    }
    if ((gravity_function_t *)(f.p)->htable != (gravity_function_t *)0x0) {
      gravity_function_free((gravity_vm *)0x0,(gravity_function_t *)(f.p)->htable);
    }
  }
  if ((5 < *(uint *)((long)&(key.field_1.p)->identifier + 4)) &&
     (iVar1 = string_casencmp((char *)(key.field_1.p)->objclass,"$init",5), iVar1 == 0)) {
    return;
  }
  gravity_function_free((gravity_vm *)0x0,(gravity_function_t *)f.p);
  return;
}

Assistant:

static void internal_free_class (gravity_hash_t *hashtable, gravity_value_t key, gravity_value_t value, void *data) {
    #pragma unused (hashtable, data)

    // sanity checks
    if (!VALUE_ISA_FUNCTION(value)) return;
    if (!VALUE_ISA_STRING(key)) return;

    // check for special function
    gravity_function_t *f = VALUE_AS_FUNCTION(value);
    if (f->tag == EXEC_TYPE_SPECIAL) {
        if (f->special[0]) gravity_function_free(NULL, (gravity_function_t *)f->special[0]);
        if (f->special[1]) gravity_function_free(NULL, (gravity_function_t *)f->special[1]);
    }

    // a super special init constructor is a string that begins with $init AND it is longer than strlen($init)
    gravity_string_t *s = VALUE_AS_STRING(key);
    bool is_super_function = ((s->len > 5) && (string_casencmp(s->s, CLASS_INTERNAL_INIT_NAME, 5) == 0));
    if (!is_super_function) gravity_function_free(NULL, VALUE_AS_FUNCTION(value));
}